

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_positional_scan.cpp
# Opt level: O3

idx_t __thiscall
duckdb::PositionalTableScanner::CopyData
          (PositionalTableScanner *this,ExecutionContext *context,DataChunk *output,idx_t count,
          idx_t col_offset)

{
  ulong uVar1;
  reference pvVar2;
  reference pvVar3;
  ulong uVar4;
  idx_t source_count;
  idx_t iVar5;
  size_type sVar6;
  
  if (this->source_offset == 0) {
    if ((count <= (this->source).count) || (this->exhausted == true)) {
      if ((this->source).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (this->source).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_start) {
        iVar5 = 0;
      }
      else {
        sVar6 = 0;
        do {
          pvVar2 = vector<duckdb::Vector,_true>::operator[](&output->data,col_offset + sVar6);
          pvVar3 = vector<duckdb::Vector,_true>::operator[](&(this->source).data,sVar6);
          Vector::Reference(pvVar2,pvVar3);
          sVar6 = sVar6 + 1;
        } while (sVar6 < (ulong)(((long)(this->source).data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->source).data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                0x4ec4ec4ec4ec4ec5));
        iVar5 = this->source_offset;
      }
      this->source_offset = iVar5 + count;
      goto LAB_01583318;
    }
  }
  else if (count == 0) goto LAB_01583318;
  iVar5 = 0;
  do {
    uVar1 = count - iVar5;
    uVar4 = (this->source).count - this->source_offset;
    if (this->exhausted != false) {
      uVar4 = uVar1;
    }
    if (uVar1 < uVar4) {
      uVar4 = uVar1;
    }
    source_count = this->source_offset + uVar4;
    if ((this->source).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->source).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start) {
      sVar6 = 0;
      do {
        pvVar2 = vector<duckdb::Vector,_true>::operator[](&(this->source).data,sVar6);
        pvVar3 = vector<duckdb::Vector,_true>::operator[](&output->data,col_offset + sVar6);
        VectorOperations::Copy(pvVar2,pvVar3,source_count,this->source_offset,iVar5);
        sVar6 = sVar6 + 1;
      } while (sVar6 < (ulong)(((long)(this->source).data.
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->source).data.
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              0x4ec4ec4ec4ec4ec5));
      source_count = this->source_offset + uVar4;
    }
    iVar5 = iVar5 + uVar4;
    this->source_offset = source_count;
    Refill(this,context);
  } while (iVar5 < count);
LAB_01583318:
  return ((long)(this->source).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->source).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
}

Assistant:

idx_t CopyData(ExecutionContext &context, DataChunk &output, const idx_t count, const idx_t col_offset) {
		if (!source_offset && (source.size() >= count || exhausted)) {
			//	Fast track: aligned and has enough data
			for (idx_t i = 0; i < source.ColumnCount(); ++i) {
				output.data[col_offset + i].Reference(source.data[i]);
			}
			source_offset += count;
		} else {
			// Copy data
			for (idx_t target_offset = 0; target_offset < count;) {
				const auto needed = count - target_offset;
				const auto available = exhausted ? needed : (source.size() - source_offset);
				const auto copy_size = MinValue(needed, available);
				const auto source_count = source_offset + copy_size;
				for (idx_t i = 0; i < source.ColumnCount(); ++i) {
					VectorOperations::Copy(source.data[i], output.data[col_offset + i], source_count, source_offset,
					                       target_offset);
				}
				target_offset += copy_size;
				source_offset += copy_size;
				Refill(context);
			}
		}

		return source.ColumnCount();
	}